

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O0

wchar_t spell_collect_from_book(player *p,object *obj,int **spells)

{
  class_book_conflict *pcVar1;
  int *piVar2;
  wchar_t local_38;
  int local_34;
  wchar_t n_spells;
  wchar_t i;
  class_book_conflict *book;
  int **spells_local;
  object *obj_local;
  player *p_local;
  
  pcVar1 = player_object_to_book(p,obj);
  local_38 = L'\0';
  if (pcVar1 == (class_book_conflict *)0x0) {
    p_local._4_4_ = L'\0';
  }
  else {
    for (local_34 = 0; local_34 < pcVar1->num_spells; local_34 = local_34 + 1) {
      local_38 = local_38 + L'\x01';
    }
    piVar2 = (int *)mem_zalloc((long)local_38 << 3);
    *spells = piVar2;
    for (local_34 = 0; local_34 < pcVar1->num_spells; local_34 = local_34 + 1) {
      (*spells)[local_34] = pcVar1->spells[local_34].sidx;
    }
    p_local._4_4_ = local_38;
  }
  return p_local._4_4_;
}

Assistant:

int spell_collect_from_book(const struct player *p, const struct object *obj,
		int **spells)
{
	const struct class_book *book = player_object_to_book(p, obj);
	int i, n_spells = 0;

	if (!book) {
		return n_spells;
	}

	/* Count the spells */
	for (i = 0; i < book->num_spells; i++)
		n_spells++;

	/* Allocate the array */
	*spells = mem_zalloc(n_spells * sizeof(*spells));

	/* Write the spells */
	for (i = 0; i < book->num_spells; i++)
		(*spells)[i] = book->spells[i].sidx;

	return n_spells;
}